

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

Option * __thiscall CLI::Option::capture_default_str(Option *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((this->default_function_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator()(&local_30,&this->default_function_);
    ::std::__cxx11::string::operator=((string *)&this->default_str_,(string *)&local_30);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  return this;
}

Assistant:

Option *capture_default_str() {
        if(default_function_) {
            default_str_ = default_function_();
        }
        return this;
    }